

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

FlagRegistry * google::anon_unknown_1::FlagRegistry::GlobalRegistry(void)

{
  FlagRegistry *pFVar1;
  MutexLock local_10;
  MutexLock acquire_lock;
  
  gflags_mutex_namespace::MutexLock::MutexLock
            (&local_10,(Mutex *)&(anonymous_namespace)::FlagRegistry::global_registry_lock_);
  if ((anonymous_namespace)::FlagRegistry::global_registry_ == (FlagRegistry *)0x0) {
    pFVar1 = (FlagRegistry *)operator_new(0x68);
    FlagRegistry(pFVar1);
    (anonymous_namespace)::FlagRegistry::global_registry_ = pFVar1;
  }
  pFVar1 = (anonymous_namespace)::FlagRegistry::global_registry_;
  gflags_mutex_namespace::MutexLock::~MutexLock(&local_10);
  return pFVar1;
}

Assistant:

FlagRegistry* FlagRegistry::GlobalRegistry() {
  MutexLock acquire_lock(&global_registry_lock_);
  if (!global_registry_) {
    global_registry_ = new FlagRegistry;
  }
  return global_registry_;
}